

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O2

void __thiscall
DatalogDatabase::fixed_point
          (DatalogDatabase *this,vector<int,_std::allocator<int>_> *rule_inds,ostream *out)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t k;
  ulong uVar5;
  
  iVar2 = totalTuples(this);
  iVar4 = -1;
  while (iVar3 = iVar2, iVar3 != iVar4) {
    for (uVar5 = 0;
        piVar1 = (rule_inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(rule_inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar5 = uVar5 + 1) {
      evaluateRule(this,(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                        super__Vector_impl_data._M_start[piVar1[uVar5]],out);
    }
    iVar2 = totalTuples(this);
    iVar4 = iVar3;
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void DatalogDatabase::fixed_point(vector<int> rule_inds, ostream &out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rule_inds.size(); k++)
    {
      evaluateRule(rules[rule_inds[k]], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }
  out << endl;
}